

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O3

range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t> *
tchecker::syncprod::incoming_synchronized_edges
          (range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t>
           *__return_storage_ptr__,system_t *system,
          intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
          *vloc)

{
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  syncs;
  vloc_synchronized_edges_iterator_t begin;
  shared_ptr<const_tchecker::system::loc_edges_maps_t> local_c0;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  local_b0;
  vloc_synchronized_edges_iterator_t local_a0;
  
  local_b0 = tchecker::system::synchronizations_t::synchronizations
                       (&(system->super_system_t).super_synchronizations_t);
  tchecker::system::edges_t::incoming_edges_maps(&(system->super_system_t).super_edges_t);
  vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t
            (&local_a0,vloc,&local_c0,&local_b0._begin,&local_b0._end);
  if (local_c0.
      super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.
               super___shared_ptr<const_tchecker::system::loc_edges_maps_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t
            (&__return_storage_ptr__->_begin,&local_a0);
  vloc_synchronized_edges_iterator_t::~vloc_synchronized_edges_iterator_t(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

tchecker::range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t, tchecker::end_iterator_t>
incoming_synchronized_edges(tchecker::syncprod::system_t const & system,
                            tchecker::intrusive_shared_ptr_t<tchecker::shared_vloc_t const> const & vloc)
{
  auto syncs = system.synchronizations();
  tchecker::syncprod::vloc_synchronized_edges_iterator_t begin(vloc, system.incoming_edges_maps(), syncs.begin(), syncs.end());

  return tchecker::make_range(begin, tchecker::past_the_end_iterator);
}